

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O2

uint32_t FAPOBase_ValidateFormatPair
                   (FAPOBase *fapo,FAudioWaveFormatEx *pSupportedFormat,
                   FAudioWaveFormatEx *pRequestedFormat,uint8_t fOverwrite)

{
  uint32_t uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  
  if (((((pRequestedFormat->wFormatTag != 3) ||
        ((ushort)(pRequestedFormat->nChannels - 0x41) < 0xffc0)) ||
       (pRequestedFormat->nSamplesPerSec - 0x30d41 < 0xfffcf6a7)) ||
      (uVar1 = 0, pRequestedFormat->wBitsPerSample != 0x20)) &&
     (uVar1 = 0x88970001, fOverwrite != '\0')) {
    pRequestedFormat->wFormatTag = 3;
    uVar2 = pRequestedFormat->nChannels + (ushort)(pRequestedFormat->nChannels == 0);
    uVar3 = 0x40;
    if (uVar2 < 0x40) {
      uVar3 = uVar2;
    }
    pRequestedFormat->nChannels = uVar3;
    uVar4 = 1000;
    if (1000 < pRequestedFormat->nSamplesPerSec) {
      uVar4 = pRequestedFormat->nSamplesPerSec;
    }
    if (199999 < uVar4) {
      uVar4 = 200000;
    }
    pRequestedFormat->nSamplesPerSec = uVar4;
    pRequestedFormat->wBitsPerSample = 0x20;
  }
  return uVar1;
}

Assistant:

uint32_t FAPOBase_ValidateFormatPair(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pSupportedFormat,
	FAudioWaveFormatEx *pRequestedFormat,
	uint8_t fOverwrite
) {
	if (	pRequestedFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (fOverwrite)
		{
			pRequestedFormat->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			pRequestedFormat->nChannels = FAudio_clamp(
				pRequestedFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			pRequestedFormat->nSamplesPerSec = FAudio_clamp(
				pRequestedFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			pRequestedFormat->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}